

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O0

void Vec_MemHashResize(Vec_Mem_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  int *pSpot;
  word *pwStack_18;
  int i;
  word *pEntry;
  Vec_Mem_t *p_local;
  
  p_00 = p->vTable;
  iVar1 = Vec_IntSize(p->vTable);
  iVar1 = Abc_PrimeCudd(iVar1 << 1);
  Vec_IntFill(p_00,iVar1,-1);
  Vec_IntClear(p->vNexts);
  pSpot._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_MemEntryNum(p);
    bVar4 = false;
    if (pSpot._4_4_ < iVar1) {
      pwStack_18 = Vec_MemReadEntry(p,pSpot._4_4_);
      bVar4 = pwStack_18 != (word *)0x0;
    }
    if (!bVar4) break;
    piVar3 = Vec_MemHashLookup(p,pwStack_18);
    if (*piVar3 != -1) {
      __assert_fail("*pSpot == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                    ,0x161,"void Vec_MemHashResize(Vec_Mem_t *)");
    }
    iVar1 = Vec_IntSize(p->vNexts);
    *piVar3 = iVar1;
    Vec_IntPush(p->vNexts,-1);
    pSpot._4_4_ = pSpot._4_4_ + 1;
  }
  iVar1 = p->nEntries;
  iVar2 = Vec_IntSize(p->vNexts);
  if (iVar1 == iVar2) {
    return;
  }
  __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                ,0x165,"void Vec_MemHashResize(Vec_Mem_t *)");
}

Assistant:

static void Vec_MemHashResize( Vec_Mem_t * p )
{
    word * pEntry;
    int i, * pSpot;
    Vec_IntFill( p->vTable, Abc_PrimeCudd(2 * Vec_IntSize(p->vTable)), -1 );
    Vec_IntClear( p->vNexts );
    Vec_MemForEachEntry( p, pEntry, i )
    {
        pSpot = Vec_MemHashLookup( p, pEntry );
        assert( *pSpot == -1 );
        *pSpot = Vec_IntSize(p->vNexts);
        Vec_IntPush( p->vNexts, -1 );
    }
    assert( p->nEntries == Vec_IntSize(p->vNexts) );
}